

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  uchar *data_00;
  uchar *data;
  uint error;
  LodePNGTime *time_local;
  ucvector *out_local;
  
  data_00 = (uchar *)lodepng_malloc(7);
  if (data_00 == (uchar *)0x0) {
    out_local._4_4_ = 0x53;
  }
  else {
    *data_00 = (uchar)(time->year >> 8);
    data_00[1] = (uchar)time->year;
    data_00[2] = (uchar)time->month;
    data_00[3] = (uchar)time->day;
    data_00[4] = (uchar)time->hour;
    data_00[5] = (uchar)time->minute;
    data_00[6] = (uchar)time->second;
    out_local._4_4_ = addChunk(out,"tIME",data_00,7);
    lodepng_free(data_00);
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time)
{
  unsigned error = 0;
  unsigned char* data = (unsigned char*)lodepng_malloc(7);
  if(!data) return 83; /*alloc fail*/
  data[0] = (unsigned char)(time->year >> 8);
  data[1] = (unsigned char)(time->year & 255);
  data[2] = (unsigned char)time->month;
  data[3] = (unsigned char)time->day;
  data[4] = (unsigned char)time->hour;
  data[5] = (unsigned char)time->minute;
  data[6] = (unsigned char)time->second;
  error = addChunk(out, "tIME", data, 7);
  lodepng_free(data);
  return error;
}